

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

int demo_choice_proc(DEMO_MENU *item,int msg,int extra)

{
  int iVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  undefined4 uVar14;
  float fVar15;
  undefined4 uVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 in_XMM1_Da;
  
  lVar13 = -1;
  iVar10 = -2;
  do {
    iVar10 = iVar10 + 1;
    lVar2 = lVar13 + 1;
    lVar13 = lVar13 + 1;
  } while (item->data[lVar2] != (void *)0x0);
  iVar4 = screen_width / 6;
  if (msg == 3) {
    _Var3 = key_pressed(0x52);
    if ((_Var3) && (0 < item->extra)) {
      item->extra = item->extra + -1;
      play_sound_id(7,0xff,0x80,-100,0);
      if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
        (*item->on_activate)(item);
      }
    }
    _Var3 = key_pressed(0x53);
    if (!_Var3) {
      return 1000;
    }
    if (iVar10 <= item->extra) {
      return 1000;
    }
    iVar4 = item->extra + 1;
  }
  else {
    iVar7 = (int)lVar13;
    if (msg == 1) {
      if (lVar13 == 0) {
        return 1000;
      }
      uVar14 = al_map_rgb(0xff,0xff,(((uint)item->flags >> 1 & 1) != 0) + -1);
      iVar6 = (screen_width - iVar4) / 2;
      uVar18 = in_XMM1_Da;
      shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,iVar6 + -8,extra,1,(int)item->name,uVar14,
                        in_XMM1_Da);
      iVar5 = al_get_font_line_height(demo_data[1].dat);
      iVar1 = iVar5 / 2;
      if (iVar5 / 2 < 9) {
        iVar1 = 8;
      }
      iVar5 = al_get_font_line_height(demo_data[1].dat);
      iVar5 = (iVar5 - iVar1) / 2;
      iVar8 = shadow_offset + iVar6;
      iVar12 = iVar5 + extra;
      fVar15 = (float)(iVar12 + shadow_offset);
      iVar9 = shadow_offset + iVar6 + iVar4;
      iVar11 = shadow_offset + iVar12 + iVar1;
      uVar16 = al_map_rgb(0,0,0);
      al_draw_rectangle((float)iVar8,fVar15,(float)iVar9,(float)iVar11,uVar16,uVar18,0x3f800000);
      iVar9 = iVar4 + -4;
      iVar8 = 8;
      if (8 < iVar9 / iVar7) {
        iVar8 = iVar9 / iVar7;
      }
      iVar7 = (item->extra * iVar9) / iVar7;
      iVar11 = iVar9 - iVar8;
      if (iVar7 + iVar8 <= iVar9) {
        iVar11 = iVar7;
      }
      iVar7 = iVar9 - iVar11;
      if (item->extra != iVar10) {
        iVar7 = iVar8;
      }
      fVar17 = (float)(iVar12 + iVar1);
      uVar18 = al_map_rgb(0,0,0);
      al_draw_filled_rectangle
                ((float)(iVar11 + iVar6 + 3),(float)(iVar5 + 3 + extra),
                 (float)(iVar7 + 3 + iVar11 + iVar6),fVar17,uVar18,fVar15);
      al_draw_rectangle((float)iVar6,(float)iVar12,(float)(iVar6 + iVar4),fVar17,uVar14,in_XMM1_Da,
                        0x3f800000);
      al_draw_filled_rectangle
                ((float)(iVar11 + iVar6 + 2),(float)(iVar5 + 2 + extra),
                 (float)(iVar7 + 2 + iVar11 + iVar6),(float)(iVar1 + -2 + iVar12),uVar14,in_XMM1_Da)
      ;
      shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,iVar6 + 8 + iVar4,extra,0,
                        (int)item->data[item->extra],uVar14,in_XMM1_Da);
      return 1000;
    }
    if (extra != 0xd || msg != 2) {
      if (msg == 5) {
        iVar10 = demo_text_proc(item,5,extra);
        return iVar10;
      }
      if (msg != 4) {
        return 1000;
      }
      iVar10 = al_get_text_width(demo_data[1].dat,item->name,(long)screen_width % 6 & 0xffffffff);
      for (lVar13 = 0; *(long *)((long)item->data + lVar13) != 0; lVar13 = lVar13 + 8) {
        iVar7 = al_get_text_width(demo_data[1].dat);
        if (iVar10 < iVar7) {
          iVar10 = iVar7;
        }
      }
      iVar7 = al_get_text_width(demo_data[1].dat,item->name);
      if (iVar10 < iVar7) {
        iVar10 = al_get_text_width(demo_data[1].dat,item->name);
      }
      return iVar4 + 0x10 + iVar10 * 2;
    }
    _Var3 = mouse_button_pressed(1);
    if (!_Var3) {
      return 1000;
    }
    iVar10 = screen_width - iVar4;
    iVar6 = mouse_x();
    iVar4 = ((iVar6 + iVar10 / -2) * iVar7) / iVar4;
  }
  item->extra = iVar4;
  play_sound_id(7,0xff,0x80,-100,0);
  if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
    (*item->on_activate)(item);
  }
  return 1000;
}

Assistant:

int demo_choice_proc(DEMO_MENU * item, int msg, int extra)
{
   int x, cw, ch, dy, cx;
   int choice_count = 0;
   int slider_width = screen_width / 6;
   int i, tmp;
   ALLEGRO_COLOR col;

   /* count number of choices */
   for (; item->data[choice_count] != 0; choice_count++);

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (!choice_count) return DEMO_MENU_CONTINUE;
      if (item->flags & DEMO_MENU_SELECTED) {
         col = al_map_rgb(255, 255, 0);
      } else {
         col = al_map_rgb(255, 255, 255);
      }

      /* starting position */
      x = (screen_width - slider_width) / 2;

      /* print name of the item */
      shadow_textprintf(demo_font, x - 8, extra, col, 1,
                      item->name);

      /* draw slider thingy */
      ch = al_get_font_line_height(demo_font) / 2;
      ch = MAX(8, ch);
      dy = (al_get_font_line_height(demo_font) - ch) / 2;

      /* shadow */
      al_draw_rectangle(x + shadow_offset,
           extra + dy + shadow_offset,
           x + slider_width + shadow_offset, extra + dy + ch + shadow_offset,
           al_map_rgb(0, 0, 0), 1);
      cw = (slider_width - 4) / choice_count;
      cw = MAX(cw, 8);
      cx = (slider_width - 4) * item->extra / choice_count;
      if (cx + cw > slider_width - 4) {
         cx = slider_width - 4 - cw;
      }
      if (item->extra == choice_count - 1) {
         cw = slider_width - 4 - cx;
      }
      al_draw_filled_rectangle(x + 3 + cx, extra + dy + 3,
               x + 3 + cx + cw, extra + dy + ch, al_map_rgb(0, 0, 0));

      /* slider */
      al_draw_rectangle(x, extra + dy, x + slider_width, extra + dy + ch,
           col, 1);
      al_draw_filled_rectangle(x + 2 + cx, extra + dy + 2, x + 2 + cx + cw,
               extra + dy + ch - 2, col);

      x += slider_width;

      /* print selected choice */
      shadow_textprintf(demo_font, x + 8, extra, col,
                      0, (char *)(item->data)[item->extra]);
   } else if (msg == DEMO_MENU_MSG_KEY) {
      if (key_pressed(ALLEGRO_KEY_LEFT)) {
         if (item->extra > 0) {
            --item->extra;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

            if (item->on_activate) {
               item->on_activate(item);
            }
         }
      }
            
      if (key_pressed(ALLEGRO_KEY_RIGHT)) {
         if (item->extra < choice_count - 1) {
            ++item->extra;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

            if (item->on_activate) {
               item->on_activate(item);
            }
         }
      }
   } else if (msg == DEMO_MENU_MSG_CHAR && extra == 13) {
      if (mouse_button_pressed(1)) {
         x = (screen_width - slider_width) / 2;
         item->extra = (mouse_x() - x) * choice_count / slider_width;
         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
         if (item->on_activate) {
            item->on_activate(item);
         }
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      cw = al_get_text_width(demo_font, item->name);
      for (i = 0; item->data[i] != 0; i++) {
         tmp = al_get_text_width(demo_font, (char *)(item->data)[i]);
         if (tmp > cw) {
            cw = tmp;
         }
      }

      return MAX(al_get_text_width(demo_font, item->name),
                 cw) * 2 + slider_width + 2 * 8;
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return demo_text_proc(item, msg, extra);
   }

   return DEMO_MENU_CONTINUE;
}